

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_vector.c
# Opt level: O0

exr_result_t
exr_attr_float_vector_create(exr_context_t ctxt,exr_attr_float_vector_t *fv,float *arr,int32_t nent)

{
  int32_t in_ECX;
  exr_attr_float_vector_t *in_RDX;
  exr_context_t in_RSI;
  long in_RDI;
  float *outp;
  size_t bytes;
  exr_result_t rv;
  exr_result_t local_4;
  
  if (in_RDI == 0) {
    local_4 = 2;
  }
  else if ((in_RSI == (exr_context_t)0x0) || (in_RDX == (exr_attr_float_vector_t *)0x0)) {
    local_4 = (**(code **)(in_RDI + 0x40))
                        (in_RDI,3,"Invalid (NULL) arguments to float vector create");
  }
  else {
    local_4 = exr_attr_float_vector_init(in_RSI,in_RDX,in_ECX);
    if (((local_4 == 0) && (0 < in_ECX)) && ((ulong)((long)in_ECX << 2) < 0x80000000)) {
      memcpy(*(void **)&in_RSI->filename,in_RDX,(long)in_ECX << 2);
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_float_vector_create (
    exr_context_t            ctxt,
    exr_attr_float_vector_t* fv,
    const float*             arr,
    int32_t                  nent)
{
    exr_result_t rv = EXR_ERR_UNKNOWN;

    if (!ctxt) return EXR_ERR_MISSING_CONTEXT_ARG;

    if (!fv || !arr)
        return ctxt->report_error (
            ctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid (NULL) arguments to float vector create");

    rv = exr_attr_float_vector_init (ctxt, fv, nent);
    if (rv == EXR_ERR_SUCCESS && nent > 0)
    {
        size_t bytes = (size_t) (nent) * sizeof (float);
        if (bytes <= (size_t) INT32_MAX)
        {
            float* outp = EXR_CONST_CAST (float*, fv->arr);
            memcpy (outp, arr, bytes);
        }
    }

    return rv;
}